

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsParallel.h
# Opt level: O3

void highs::parallel::for_each<HEkkDual::majorUpdatePrimal()::__1&>
               (HighsInt start,HighsInt end,anon_class_40_5_b11b0fa6 *f,HighsInt grainSize)

{
  __atomic_base<int> _Var1;
  element_type *peVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  pointer pdVar7;
  HighsSplitDeque *pHVar8;
  uint uVar9;
  long *plVar10;
  ulong uVar11;
  uint32_t uVar12;
  int start_00;
  long lVar13;
  double dVar14;
  TaskGroup tg;
  TaskGroup local_40;
  
  if (grainSize < end - start) {
    HighsTaskExecutor::threadLocalWorkerDequePtr::__tls_init();
    plVar10 = (long *)__tls_get_addr(&PTR_00441ef0);
    local_40.workerDeque = (HighsSplitDeque *)*plVar10;
    local_40.dequeHead = ((local_40.workerDeque)->ownerData).head;
    do {
      pHVar8 = local_40.workerDeque;
      start_00 = start + end >> 1;
      uVar9 = ((local_40.workerDeque)->ownerData).head;
      uVar11 = (ulong)uVar9;
      if (uVar11 < 0x2000) {
        uVar12 = (uint32_t)(uVar11 + 1);
        ((local_40.workerDeque)->ownerData).head = uVar12;
        ((local_40.workerDeque)->taskArray)._M_elems[uVar11].metadata.stealer.
        super___atomic_base<unsigned_long>._M_i = 0;
        *(undefined ***)((local_40.workerDeque)->taskArray)._M_elems[uVar11].taskData =
             &PTR_operator___00441688;
        *(int *)(((local_40.workerDeque)->taskArray)._M_elems[uVar11].taskData + 8) = start_00;
        *(HighsInt *)(((local_40.workerDeque)->taskArray)._M_elems[uVar11].taskData + 0xc) = end;
        *(HighsInt *)(((local_40.workerDeque)->taskArray)._M_elems[uVar11].taskData + 0x10) =
             grainSize;
        *(anon_class_40_5_b11b0fa6 **)
         (((local_40.workerDeque)->taskArray)._M_elems[uVar11].taskData + 0x18) = f;
        if (((local_40.workerDeque)->ownerData).allStolenCopy == true) {
          ((local_40.workerDeque)->stealerData).ts.super___atomic_base<unsigned_long>._M_i =
               uVar11 << 0x20 | uVar11 + 1;
          ((local_40.workerDeque)->stealerData).allStolen._M_base._M_i = false;
          ((local_40.workerDeque)->ownerData).splitCopy = uVar12;
          ((local_40.workerDeque)->ownerData).allStolenCopy = false;
          if ((((local_40.workerDeque)->splitRequest)._M_base._M_i & 1U) != 0) {
            ((local_40.workerDeque)->splitRequest)._M_base._M_i = false;
          }
          peVar2 = ((local_40.workerDeque)->ownerData).workerBunk.
                   super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          LOCK();
          _Var1._M_i = (peVar2->haveJobs).super___atomic_base<int>._M_i;
          (peVar2->haveJobs).super___atomic_base<int>._M_i =
               (peVar2->haveJobs).super___atomic_base<int>._M_i + 1;
          UNLOCK();
          if (_Var1._M_i < ((local_40.workerDeque)->ownerData).numWorkers + -1) {
            HighsSplitDeque::WorkerBunk::publishWork
                      (((local_40.workerDeque)->ownerData).workerBunk.
                       super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,local_40.workerDeque);
          }
        }
        else {
          HighsSplitDeque::growShared(local_40.workerDeque);
        }
      }
      else {
        if ((((local_40.workerDeque)->ownerData).splitCopy < 0x2000) &&
           (((local_40.workerDeque)->ownerData).allStolenCopy == false)) {
          HighsSplitDeque::growShared(local_40.workerDeque);
          uVar9 = (pHVar8->ownerData).head;
        }
        (pHVar8->ownerData).head = uVar9 + 1;
        for_each<HEkkDual::majorUpdatePrimal()::__1&>(start_00,end,f,grainSize);
      }
      end = start_00;
    } while (grainSize < start_00 - start);
    if (start < start_00) {
      pdVar3 = *f->colArray;
      pdVar4 = f->new_pivotal_edge_weight;
      pdVar5 = f->Kai;
      pdVar6 = *f->dseArray;
      pdVar7 = (f->edge_weight->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar13 = (long)start;
      do {
        dVar14 = (*pdVar4 * pdVar3[lVar13] + *pdVar5 * pdVar6[lVar13]) * pdVar3[lVar13] +
                 pdVar7[lVar13];
        if (dVar14 <= 0.0001) {
          dVar14 = 0.0001;
        }
        pdVar7[lVar13] = dVar14;
        lVar13 = lVar13 + 1;
      } while (start_00 != lVar13);
    }
    TaskGroup::taskWait(&local_40);
    TaskGroup::~TaskGroup(&local_40);
  }
  else if (start < end) {
    pdVar3 = *f->colArray;
    pdVar4 = f->new_pivotal_edge_weight;
    pdVar5 = f->Kai;
    pdVar6 = *f->dseArray;
    pdVar7 = (f->edge_weight->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar13 = (long)start;
    do {
      dVar14 = (*pdVar4 * pdVar3[lVar13] + *pdVar5 * pdVar6[lVar13]) * pdVar3[lVar13] +
               pdVar7[lVar13];
      if (dVar14 <= 0.0001) {
        dVar14 = 0.0001;
      }
      pdVar7[lVar13] = dVar14;
      lVar13 = lVar13 + 1;
    } while (end != lVar13);
  }
  return;
}

Assistant:

void for_each(HighsInt start, HighsInt end, F&& f, HighsInt grainSize = 1) {
  if (end - start <= grainSize) {
    f(start, end);
  } else {
    TaskGroup tg;

    do {
      HighsInt split = (start + end) >> 1;
      tg.spawn([split, end, grainSize, &f]() {
        for_each(split, end, f, grainSize);
      });
      end = split;
    } while (end - start > grainSize);

    f(start, end);
    tg.taskWait();
  }
}